

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall SubtableSymbol::buildDecisionTree(SubtableSymbol *this,DecisionProperties *props)

{
  pointer ppCVar1;
  Pattern *pat;
  int iVar2;
  DecisionNode *pDVar3;
  undefined4 extraout_var;
  int4 j;
  ulong uVar4;
  int4 i;
  ulong uVar5;
  
  if (this->pattern != (TokenPattern *)0x0) {
    pDVar3 = (DecisionNode *)operator_new(0x48);
    DecisionNode::DecisionNode(pDVar3,(DecisionNode *)0x0);
    this->decisiontree = pDVar3;
    uVar5 = 0;
    while( true ) {
      ppCVar1 = (this->construct).super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->construct).
                        super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar5) break;
      pat = ppCVar1[uVar5]->pattern->pattern;
      iVar2 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[8])(pat);
      if (iVar2 == 0) {
        DecisionNode::addConstructorPair
                  (this->decisiontree,(DisjointPattern *)pat,
                   (this->construct).
                   super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5]);
      }
      else {
        uVar4 = 0;
        while( true ) {
          iVar2 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[8])(pat);
          if (iVar2 <= (int)uVar4) break;
          pDVar3 = this->decisiontree;
          iVar2 = (*((Pattern *)&pat->_vptr_Pattern)->_vptr_Pattern[9])(pat,uVar4);
          DecisionNode::addConstructorPair
                    (pDVar3,(DisjointPattern *)CONCAT44(extraout_var,iVar2),
                     (this->construct).
                     super__Vector_base<Constructor_*,_std::allocator<Constructor_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5]);
          uVar4 = (ulong)((int)uVar4 + 1);
        }
      }
      uVar5 = uVar5 + 1;
    }
    DecisionNode::split(this->decisiontree,props);
    return;
  }
  return;
}

Assistant:

void SubtableSymbol::buildDecisionTree(DecisionProperties &props)

{				// Associate pattern disjoints to constructors
  if (pattern == (TokenPattern *)0) return; // Pattern not fully formed
  Pattern *pat;
  decisiontree = new DecisionNode((DecisionNode *)0);
  for(int4 i=0;i<construct.size();++i) {
    pat = construct[i]->getPattern()->getPattern();
    if (pat->numDisjoint() == 0)
      decisiontree->addConstructorPair((const DisjointPattern *)pat,construct[i]);
    else
      for(int4 j=0;j<pat->numDisjoint();++j)
	decisiontree->addConstructorPair(pat->getDisjoint(j),construct[i]);
  }
  decisiontree->split(props);	// Create the decision strategy
}